

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_barrier.cpp
# Opt level: O2

void __thiscall SharedBarrier::SharedBarrier(SharedBarrier *this,uint32_t count)

{
  __uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  __p;
  __pid_t _Var1;
  __uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  local_20;
  
  (this->barrier_)._M_t.
  super___uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>._M_head_impl =
       (SharedMemoryObject<pthread_barrier_t> *)0x0;
  std::make_unique<SharedMemoryObject<pthread_barrier_t>>();
  __p._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>._M_head_impl =
       local_20._M_t.
       super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
       .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>._M_head_impl;
  local_20._M_t.
  super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>._M_head_impl =
       (tuple<SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
        )(_Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ::reset((__uniq_ptr_impl<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
           *)this,(pointer)__p._M_t.
                           super__Tuple_impl<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
                           .super__Head_base<0UL,_SharedMemoryObject<pthread_barrier_t>_*,_false>.
                           _M_head_impl);
  std::
  unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
  ::~unique_ptr((unique_ptr<SharedMemoryObject<pthread_barrier_t>,_std::default_delete<SharedMemoryObject<pthread_barrier_t>_>_>
                 *)&local_20);
  init(this,(EVP_PKEY_CTX *)(ulong)count);
  _Var1 = getpid();
  this->owner_pid_ = _Var1;
  return;
}

Assistant:

SharedBarrier::SharedBarrier(uint32_t count) {
    barrier_ = std::make_unique<SharedMemoryObject<pthread_barrier_t>>();
    init(count);
    owner_pid_ = getpid();
}